

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smf.c
# Opt level: O2

int smf_event_is_tempo_change_or_time_signature(smf_event_t *event)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = smf_event_is_metadata(event);
  if (iVar1 == 0) {
    uVar2 = 0;
  }
  else {
    if (event->midi_buffer_length < 2) {
      __assert_fail("event->midi_buffer_length >= 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf.c"
                    ,0x277,"int smf_event_is_tempo_change_or_time_signature(const smf_event_t *)");
    }
    uVar2 = (uint)(event->midi_buffer[1] == 'X' || event->midi_buffer[1] == 'Q');
  }
  return uVar2;
}

Assistant:

int
smf_event_is_tempo_change_or_time_signature(const smf_event_t *event)
{
	if (!smf_event_is_metadata(event))
		return (0);

	assert(event->midi_buffer_length >= 2);

	if (event->midi_buffer[1] == 0x51 || event->midi_buffer[1] == 0x58)
		return (1);

	return (0);
}